

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int arkSetMaxConvFails(void *arkode_mem,int maxncf)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxConvFails","arkode_mem = NULL illegal.")
    ;
  }
  else {
    if (maxncf < 1) {
      *(undefined4 *)((long)arkode_mem + 0x1cc) = 10;
    }
    else {
      *(int *)((long)arkode_mem + 0x1cc) = maxncf;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMaxConvFails(void *arkode_mem, int maxncf)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxConvFails", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* argument <= 0 sets default, otherwise set input */
  if (maxncf <= 0) {
    ark_mem->maxncf = MAXNCF;
  } else {
    ark_mem->maxncf = maxncf;
  }
  return(ARK_SUCCESS);
}